

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildTestDepFileOK::Run(BuildTestDepFileOK *this)

{
  VirtualFileSystem *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  Test *pTVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Node *pNVar9;
  string err;
  string local_98;
  string local_78;
  Edge *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  ppEVar3 = *(pointer *)
             ((long)&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_.
                     super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                     super__Vector_impl_data + 8);
  ppEVar4 = (this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_.
            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  iVar7 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cc\n  command = cc $in\n  depfile = $out.d\nbuild foo.o: cc foo.c\n",
              (ManifestParserOptions)0x0);
  iVar8 = g_current_test->assertion_failures_;
  if (iVar7 == iVar8) {
    local_58 = (*(pointer *)
                 ((long)&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_.
                         super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                         super__Vector_impl_data + 8))[-1];
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"foo.c","");
    paVar2 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"bar.h","");
    pNVar9 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_98);
    pNVar9->dirty_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"foo.o.d","");
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"foo.o: blah.h bar.h\n","");
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar5 = g_current_test;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"foo.o","");
    pNVar9 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_98,&local_50);
    testing::Test::Check
              (pTVar5,pNVar9 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x3be,"builder_.AddTarget(\"foo.o\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar5 = g_current_test;
    iVar7 = std::__cxx11::string::compare((char *)&local_50);
    bVar6 = testing::Test::Check
                      (pTVar5,iVar7 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3bf,"\"\" == err");
    if ((bVar6) &&
       (bVar6 = testing::Test::Check
                          (g_current_test,
                           (long)(this->super_BuildTest).fs_.files_read_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_BuildTest).fs_.files_read_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x20,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x3c0,"1u == fs_.files_read_.size()"), pTVar5 = g_current_test, bVar6))
    {
      iVar7 = std::__cxx11::string::compare
                        ((char *)(this->super_BuildTest).fs_.files_read_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar5,iVar7 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x3c1,"\"foo.o.d\" == fs_.files_read_[0]");
      bVar6 = testing::Test::Check
                        (g_current_test,
                         (int)((ulong)((long)ppEVar3 - (long)ppEVar4) >> 3) + 3 ==
                         (int)((ulong)((long)*(pointer *)
                                              ((long)&(this->super_BuildTest).
                                                      super_StateTestWithBuiltinRules.state_.edges_.
                                                                                                            
                                                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                      (long)(this->super_BuildTest).super_StateTestWithBuiltinRules.
                                            state_.edges_.
                                            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3),
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x3c5,"orig_edges + 3 == (int)state_.edges_.size()");
      if ((bVar6) &&
         (bVar6 = testing::Test::Check
                            (g_current_test,
                             (long)(local_58->inputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(local_58->inputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start == 0x18,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x3c7,"3u == edge->inputs_.size()"), pTVar5 = g_current_test, bVar6))
      {
        Edge::EvaluateCommand_abi_cxx11_(&local_98,local_58,false);
        iVar7 = std::__cxx11::string::compare((char *)&local_98);
        bVar6 = testing::Test::Check
                          (pTVar5,iVar7 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x3ca,"\"cc foo.c\" == edge->EvaluateCommand()");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) goto LAB_0012c33c;
      }
    }
    iVar8 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar8 + 1;
LAB_0012c33c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildTest, DepFileOK) {
  string err;
  int orig_edges = state_.edges_.size();
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n  depfile = $out.d\n"
"build foo.o: cc foo.c\n"));
  Edge* edge = state_.edges_.back();

  fs_.Create("foo.c", "");
  GetNode("bar.h")->MarkDirty();  // Mark bar.h as missing.
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, fs_.files_read_.size());
  EXPECT_EQ("foo.o.d", fs_.files_read_[0]);

  // Expect three new edges: one generating foo.o, and two more from
  // loading the depfile.
  ASSERT_EQ(orig_edges + 3, (int)state_.edges_.size());
  // Expect our edge to now have three inputs: foo.c and two headers.
  ASSERT_EQ(3u, edge->inputs_.size());

  // Expect the command line we generate to only use the original input.
  ASSERT_EQ("cc foo.c", edge->EvaluateCommand());
}